

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_simple_key(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  
  if (((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) ||
     (lVar1 = *(long *)(((*apArg)->x).iVal + 0x20), lVar1 == 0)) {
    jx9_result_null(pCtx);
  }
  else if (*(int *)(lVar1 + 8) == 1) {
    jx9_result_int64(pCtx,*(jx9_int64 *)(lVar1 + 0x10));
  }
  else {
    jx9_result_string(pCtx,*(char **)(lVar1 + 0x18),*(int *)(lVar1 + 0x20));
  }
  return 0;
}

Assistant:

static int jx9_hashmap_simple_key(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap_node *pCur;
	jx9_hashmap *pMap;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	pCur = pMap->pCur;
	if( pCur == 0 ){
		/* Cursor does not point to anything, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( pCur->iType == HASHMAP_INT_NODE){
		/* Key is integer */
		jx9_result_int64(pCtx, pCur->xKey.iKey);
	}else{
		/* Key is blob */
		jx9_result_string(pCtx, 
			(const char *)SyBlobData(&pCur->xKey.sKey), (int)SyBlobLength(&pCur->xKey.sKey));
	}
	return JX9_OK;
}